

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O1

void __thiscall MemoryProfiler::Print(MemoryProfiler *this)

{
  bool bVar1;
  long lVar2;
  
  Output::Print(
               L"-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=\n"
               );
  Output::Print(L"Allocation for thread 0x%08X\n");
  Output::Print(
               L"-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=\n"
               );
  lVar2 = 0x218;
  do {
    if (*(long *)((long)&(this->pageAllocator)._vptr_PageAllocatorBase + lVar2) != 0) {
      Output::Print(L"%-10s:%-20s | %-15s | %-15s | %10s | %10s | %11s | %11s\n",L"",
                    L"         Current",L"   Alloc Seg",L"    Free Seg",L"Request",L"Released",
                    L"Decommitted",L"Recommitted");
      Output::Print(L"%-10s:%9s %10s | %4s %10s | %4s %10s | %10s | %10s | %10s | %10s\n",L"",
                    L"Bytes",L"Peak",L"#",L"Bytes",L"#",L"Bytes",L"Bytes",L"Bytes",L"Bytes",L"Bytes"
                   );
      Output::Print(
                   L"------------------------------------------------------------------------------------------------------------------\n"
                   );
      PrintPageMemoryData(this->pageMemoryData,"Thread");
      PrintPageMemoryData(this->pageMemoryData + 1,"Diag");
      PrintPageMemoryData(this->pageMemoryData + 2,"CustomHeap");
      PrintPageMemoryData(this->pageMemoryData + 3,"BGJIT");
      PrintPageMemoryData(this->pageMemoryData + 4,"GCThread");
      PrintPageMemoryData(this->pageMemoryData + 5,"Recycler");
      Output::Print(
                   L"------------------------------------------------------------------------------------------------------------------\n"
                   );
      break;
    }
    lVar2 = lVar2 + 0x50;
  } while (lVar2 != 0x3f8);
  if ((this->recyclerMemoryData).requestCount != 0) {
    Output::Print(L"%-10s:%7s %10s %10s %10s\n",L"Recycler",L"#Alloc",L"AllocBytes",L"ReqBytes",
                  L"AlignByte");
    Output::Print(
                 L"--------------------------------------------------------------------------------------------------------\n"
                 );
    Output::Print(L"%-10s:%7d %10d %10d %10d\n",L"",(this->recyclerMemoryData).requestCount,
                  (this->recyclerMemoryData).alignmentBytes +
                  (this->recyclerMemoryData).requestBytes);
    Output::Print(
                 L"--------------------------------------------------------------------------------------------------------\n"
                 );
  }
  bVar1 = Js::Phases::IsEnabled((Phases *)(Js::Configuration::Global + 0x262f8),AllPhase);
  if (bVar1) {
    PrintArena(this,false);
  }
  PrintArena(this,true);
  return;
}

Assistant:

void
MemoryProfiler::Print()
{
    Output::Print(_u("-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=\n"));
    Output::Print(_u("Allocation for thread 0x%08X\n"), threadId);
    Output::Print(_u("-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=-=\n"));

    bool hasData = false;
    for (int i = 0; i < PageAllocatorType_Max; i++)
    {
        if (pageMemoryData[i].allocSegmentCount != 0)
        {
            hasData = true;
            break;
        }
    }
    if (hasData)
    {
        Output::Print(_u("%-10s:%-20s | %-15s | %-15s | %10s | %10s | %11s | %11s\n"), _u(""), _u("         Current"), _u("   Alloc Seg"), _u("    Free Seg"),
            _u("Request"), _u("Released"), _u("Decommitted"), _u("Recommitted"));
        Output::Print(_u("%-10s:%9s %10s | %4s %10s | %4s %10s | %10s | %10s | %10s | %10s\n"), _u(""), _u("Bytes"), _u("Peak"), _u("#"), _u("Bytes"), _u("#"), _u("Bytes"),
             _u("Bytes"), _u("Bytes"), _u("Bytes"),  _u("Bytes"));
        Output::Print(_u("------------------------------------------------------------------------------------------------------------------\n"));

#define PAGEALLOCATOR_PRINT(i) PrintPageMemoryData(pageMemoryData[PageAllocatorType_ ## i], STRINGIZE(i));
        PAGE_ALLOCATOR_TYPE(PAGEALLOCATOR_PRINT);
        Output::Print(_u("------------------------------------------------------------------------------------------------------------------\n"));
    }

    if (recyclerMemoryData.requestCount != 0)
    {
        Output::Print(_u("%-10s:%7s %10s %10s %10s\n"),
                _u("Recycler"),
                _u("#Alloc"),
                _u("AllocBytes"),
                _u("ReqBytes"),
                _u("AlignByte"));
        Output::Print(_u("--------------------------------------------------------------------------------------------------------\n"));
        Output::Print(_u("%-10s:%7d %10d %10d %10d\n"),
            _u(""),
            recyclerMemoryData.requestCount,
            recyclerMemoryData.requestBytes + recyclerMemoryData.alignmentBytes,
            recyclerMemoryData.requestBytes,
            recyclerMemoryData.alignmentBytes);
        Output::Print(_u("--------------------------------------------------------------------------------------------------------\n"));
    }

    if (Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::AllPhase))
    {
        PrintArena(false);
    }
    PrintArena(true);
}